

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O1

void Wlc_WinCompute_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vLeaves,Vec_Int_t *vNodes)

{
  ushort uVar1;
  int iVar2;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar3;
  ulong uVar4;
  long lVar5;
  Vec_Int_t *p_00;
  
  uVar1 = *(ushort *)pObj;
  if ((char)uVar1 < '\0') {
    return;
  }
  *(ushort *)pObj = uVar1 | 0x80;
  p_00 = vLeaves;
  if ((((uVar1 & 0x3f) < 0x33) && ((0x43800030080c0U >> (uVar1 & 0x3f) & 1) != 0)) &&
     (uVar4 = (ulong)pObj->nFanins, p_00 = vNodes, 0 < (int)pObj->nFanins)) {
    lVar5 = 0;
    do {
      if ((2 < (uint)uVar4) ||
         (paVar3 = &pObj->field_10,
         (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) ==
         (undefined1  [24])0x6)) {
        paVar3 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
      }
      iVar2 = paVar3->Fanins[lVar5];
      if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      Wlc_WinCompute_rec(p,p->pObjs + iVar2,vLeaves,vNodes);
      lVar5 = lVar5 + 1;
      uVar4 = (ulong)(int)pObj->nFanins;
    } while (lVar5 < (long)uVar4);
  }
  Vec_IntPush(p_00,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
  return;
}

Assistant:

void Wlc_WinCompute_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Int_t * vNodes )
{
    Wlc_Obj_t * pFanin;  int i;
    if ( pObj->Mark )
        return;
    pObj->Mark = 1;
    if ( !Wlc_ObjIsArithm(pObj) )
    {
        Vec_IntPush( vLeaves, Wlc_ObjId(p, pObj) );
        return;
    }
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        Wlc_WinCompute_rec( p, pFanin, vLeaves, vNodes );
    Vec_IntPush( vNodes, Wlc_ObjId(p, pObj) );
}